

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderTransformFeedbackVertexAndGeometryShaderCaptureTest::iterate
          (GeometryShaderTransformFeedbackVertexAndGeometryShaderCaptureTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *description;
  qpTestResult testResult;
  bool has_shader_compilation_failed;
  char *gs_code_specialized_raw;
  char *fs_code_specialized_raw;
  char *vs_code;
  char *gs_code;
  string vs_code_specialized;
  string fs_code_specialized;
  string gs_code_specialized;
  char *vs_code_specialized_raw;
  char *tf_varyings [2];
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  long lVar5;
  
  gs_code = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nin int vertexID;\nout vec4 out_gs_1;\n\nvoid main()\n{\n    out_gs_1 = vec4(vertexID[0] * 2, vertexID[0] * 2 + 1, vertexID[0] * 2 + 2, vertexID[0] * 2 + 3);\n    gl_Position = vec4(0, 0, 0, 1);\n    EmitVertex();\n}\n"
  ;
  vs_code = 
  "${VERSION}\n\nflat out ivec4 out_vs_1;\nflat out int vertexID;\n\nvoid main()\n{\n    vertexID = gl_VertexID;\n    out_vs_1 = ivec4(gl_VertexID, gl_VertexID + 1, gl_VertexID + 2, gl_VertexID + 3);\n    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
  ;
  has_shader_compilation_failed = true;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0x934);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x93b);
  tf_varyings[0]._0_4_ = 0x1b7c421;
  tf_varyings[0]._4_4_ = 0;
  tf_varyings[1]._0_4_ = 0x1b7c418;
  tf_varyings[1]._4_4_ = 0;
  (**(code **)(lVar5 + 0x14c8))(this->m_po_id,2,tf_varyings,0x8c8c);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x941);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x947);
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&this->super_TestCaseBase,1,&dummy_fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&gs_code_specialized,&this->super_TestCaseBase,1,&gs_code);
  gs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&this->super_TestCaseBase,1,&vs_code);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,
                     &fs_code_specialized_raw,this->m_gs_id,1,&gs_code_specialized_raw,this->m_vs_id
                     ,1,&vs_code_specialized_raw,&has_shader_compilation_failed);
  if (bVar1) {
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "Program object linking successful, whereas a failure was expected.",0x42);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
    if (bVar1) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00d16fa4;
    }
  }
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00d16fa4:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
    operator_delete(vs_code_specialized._M_dataplus._M_p,
                    vs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gs_code_specialized._M_dataplus._M_p != &gs_code_specialized.field_2) {
    operator_delete(gs_code_specialized._M_dataplus._M_p,
                    gs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
    operator_delete(fs_code_specialized._M_dataplus._M_p,
                    fs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderTransformFeedbackVertexAndGeometryShaderCaptureTest::iterate()
{
	/* Define Geometry Shader for purpose of this test. */
	const char* gs_code =
		"${VERSION}\n"
		"${GEOMETRY_SHADER_REQUIRE}\n"
		"\n"
		"layout (points)                   in;\n"
		"layout (points, max_vertices = 1) out;\n"
		"\n"
		"in int vertexID;\n"
		"out vec4 out_gs_1;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    out_gs_1 = vec4(vertexID[0] * 2, vertexID[0] * 2 + 1, vertexID[0] * 2 + 2, vertexID[0] * 2 + 3);\n"
		"    gl_Position = vec4(0, 0, 0, 1);\n"
		"    EmitVertex();\n"
		"}\n";

	/* Define Vertex Shader for purpose of this test. */
	const char* vs_code = "${VERSION}\n"
						  "\n"
						  "flat out ivec4 out_vs_1;\n"
						  "flat out int vertexID;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    vertexID = gl_VertexID;\n"
						  "    out_vs_1 = ivec4(gl_VertexID, gl_VertexID + 1, gl_VertexID + 2, gl_VertexID + 3);\n"
						  "    gl_Position = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	bool has_shader_compilation_failed = true;
	bool result						   = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program object. */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call(s) failed.");

	/* Specify output variables to be captured. */
	const char* tf_varyings[] = { "out_vs_1", "out_gs_1" };

	gl.transformFeedbackVaryings(m_po_id, 2 /*count*/, tf_varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call(s) failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string gs_code_specialized		= specializeShader(1, &gs_code);
	const char* gs_code_specialized_raw = fs_code_specialized.c_str();

	std::string vs_code_specialized		= specializeShader(1, &vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	if (TestCaseBase::buildProgram(m_po_id, m_fs_id, 1,					 /* n_sh1_body_parts */
								   &fs_code_specialized_raw, m_gs_id, 1, /* n_sh2_body_parts */
								   &gs_code_specialized_raw, m_vs_id, 1, /* n_sh3_body_parts */
								   &vs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Program object linking successful, whereas a failure was expected."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}